

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::parse::anon_unknown_0::TestCase316::run(TestCase316 *this)

{
  char **ppcVar1;
  IteratorInput<char,_const_char_*> *pIVar2;
  bool bVar3;
  Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:318:31)>
  TVar4;
  Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:319:40)>
  TVar5;
  Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:319:40)>_>
  OVar6;
  Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:320:31)>
  TVar7;
  Sequence_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:318:31)>,_kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:319:40)>_>,_kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:320:31)>_>
  SVar8;
  char *pcVar9;
  char *pcVar10;
  TypeByIndex<0UL,_unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int> *pTVar11;
  TypeByIndex<1UL,_unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int> *pTVar12;
  TypeByIndex<2UL,_unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int> *pTVar13;
  bool local_1a5;
  undefined1 local_1a4 [7];
  bool _kj_shouldLog_8;
  Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_> result_2;
  Input input_2;
  StringPtr text_2;
  undefined1 local_158 [7];
  bool _kj_shouldLog_7;
  uint local_140;
  bool local_13a;
  bool local_139;
  uint local_138;
  bool _kj_shouldLog_6;
  bool _kj_shouldLog_5;
  Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int> *pTStack_130;
  bool _kj_shouldLog_4;
  Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int> *value_1;
  Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_> result_1;
  Input input_1;
  StringPtr text_1;
  undefined1 local_d8 [7];
  bool _kj_shouldLog_3;
  uint local_c0;
  bool local_b9;
  undefined1 local_b8 [7];
  bool _kj_shouldLog_2;
  uint local_a0;
  bool local_99;
  uint *puStack_98;
  bool _kj_shouldLog_1;
  uint *value2;
  Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int> *pTStack_88;
  bool _kj_shouldLog;
  Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int> *value;
  undefined1 local_6c [8];
  Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_> result;
  Input input;
  StringPtr text;
  Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:319:40)>
  local_20;
  Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:319:40)>_>
  local_1e;
  Type local_1c;
  char local_1b;
  Exactly_<char> local_1a;
  Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:318:31)>
  local_19;
  Sequence_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:318:31)>,_kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:319:40)>_>,_kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:320:31)>_>
  local_17;
  TestCase316 *pTStack_10;
  Sequence_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:318:31)>,_kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:319:40)>_>,_kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:320:31)>_>
  parser;
  TestCase316 *this_local;
  
  local_1b = 'b';
  pTStack_10 = this;
  local_1a = exactly<char>(&local_1b);
  TVar4 = transform<kj::parse::Exactly_<char>,kj::parse::(anonymous_namespace)::TestCase316::run()::__0>
                    (&local_1a,&local_1c);
  local_19.subParser = TVar4.subParser.expected;
  text.content.size_._6_1_ = 0x61;
  text.content.size_._7_1_ = exactly<char>((char *)((long)&text.content.size_ + 6));
  TVar5 = transform<kj::parse::Exactly_<char>,kj::parse::(anonymous_namespace)::TestCase316::run()::__1>
                    ((Exactly_<char> *)((long)&text.content.size_ + 7),
                     (Type *)((long)&text.content.size_ + 5));
  local_20.subParser = TVar5.subParser.expected;
  OVar6 = optional<kj::parse::Transform_<kj::parse::Exactly_<char>,kj::parse::(anonymous_namespace)::TestCase316::run()::__1>>
                    (&local_20);
  local_1e.subParser.subParser = OVar6.subParser.subParser.expected;
  text.content.size_._1_1_ = 0x72;
  text.content.size_._2_1_ = exactly<char>((char *)((long)&text.content.size_ + 1));
  TVar7 = transform<kj::parse::Exactly_<char>,kj::parse::(anonymous_namespace)::TestCase316::run()::__2>
                    ((Exactly_<char> *)((long)&text.content.size_ + 2),(Type *)&text.content.size_);
  text.content.size_._3_1_ = TVar7.subParser.expected;
  SVar8 = sequence<kj::parse::Transform_<kj::parse::Exactly_<char>,kj::parse::(anonymous_namespace)::TestCase316::run()::__0>,kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,kj::parse::(anonymous_namespace)::TestCase316::run()::__1>>,kj::parse::Transform_<kj::parse::Exactly_<char>,kj::parse::(anonymous_namespace)::TestCase316::run()::__2>>
                    (&local_19,&local_1e,
                     (Transform_<kj::parse::Exactly_<char>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:320:31)>
                      *)((long)&text.content.size_ + 3));
  local_17.rest.rest._2_1_ = SVar8.rest.rest._2_1_;
  local_17.rest.rest.first = SVar8.rest.rest.first;
  local_17._0_4_ = SVar8._0_4_;
  ppcVar1 = &input.best;
  StringPtr::StringPtr((StringPtr *)ppcVar1,"bar");
  pcVar9 = StringPtr::begin((StringPtr *)ppcVar1);
  pcVar10 = StringPtr::end((StringPtr *)ppcVar1);
  pIVar2 = (IteratorInput<char,_const_char_*> *)
           ((long)&result.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Maybe<unsigned_int>_>.
                   value.ptr + 4);
  IteratorInput<char,_const_char_*>::IteratorInput(pIVar2,pcVar9,pcVar10);
  Sequence_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:318:31)>,_kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:319:40)>_>,_kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:320:31)>_>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_> *)local_6c,
             &local_17,pIVar2);
  pTStack_88 = kj::_::readMaybe<kj::_::Tuple<unsigned_int,kj::Maybe<unsigned_int>,unsigned_int>>
                         ((Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_>
                           *)local_6c);
  if (pTStack_88 == (Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int> *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x14f);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_d8,(char (*) [33])"Expected result tuple, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_d8);
  }
  else {
    pTVar11 = get<0ul,kj::_::Tuple<unsigned_int,kj::Maybe<unsigned_int>,unsigned_int>&>(pTStack_88);
    if (*pTVar11 != 0x7b) {
      value2._7_1_ = kj::_::Debug::shouldLog(ERROR);
      while ((bool)value2._7_1_ != false) {
        value2._0_4_ = 0x7b;
        pTVar11 = get<0ul,kj::_::Tuple<unsigned_int,kj::Maybe<unsigned_int>,unsigned_int>&>
                            (pTStack_88);
        kj::_::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                   ,0x147,ERROR,
                   "\"failed: expected \" \"(123u) == (get<0>(*value))\", 123u, get<0>(*value)",
                   (char (*) [44])"failed: expected (123u) == (get<0>(*value))",(uint *)&value2,
                   pTVar11);
        value2._7_1_ = false;
      }
    }
    pTVar12 = get<1ul,kj::_::Tuple<unsigned_int,kj::Maybe<unsigned_int>,unsigned_int>&>(pTStack_88);
    puStack_98 = kj::_::readMaybe<unsigned_int>(pTVar12);
    if (puStack_98 == (uint *)0x0) {
      AddFailureAdapter::AddFailureAdapter
                ((AddFailureAdapter *)local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x14b);
      AddFailureAdapter::operator<<
                ((AddFailureAdapter *)local_b8,(char (*) [24])"Expected 456, got null.");
      AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_b8);
    }
    else if (*puStack_98 != 0x1c8) {
      local_99 = kj::_::Debug::shouldLog(ERROR);
      while (local_99 != false) {
        local_a0 = 0x1c8;
        kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                   ,0x149,ERROR,"\"failed: expected \" \"(456u) == (*value2)\", 456u, *value2",
                   (char (*) [37])"failed: expected (456u) == (*value2)",&local_a0,puStack_98);
        local_99 = false;
      }
    }
    pTVar13 = get<2ul,kj::_::Tuple<unsigned_int,kj::Maybe<unsigned_int>,unsigned_int>&>(pTStack_88);
    if (*pTVar13 != 0x315) {
      local_b9 = kj::_::Debug::shouldLog(ERROR);
      while (local_b9 != false) {
        local_c0 = 0x315;
        pTVar13 = get<2ul,kj::_::Tuple<unsigned_int,kj::Maybe<unsigned_int>,unsigned_int>&>
                            (pTStack_88);
        kj::_::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                   ,0x14d,ERROR,
                   "\"failed: expected \" \"(789u) == (get<2>(*value))\", 789u, get<2>(*value)",
                   (char (*) [44])"failed: expected (789u) == (get<2>(*value))",&local_c0,pTVar13);
        local_b9 = false;
      }
    }
  }
  bVar3 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)
                     ((long)&result.ptr.field_1.value.impl.
                             super_TupleElement<1U,_kj::Maybe<unsigned_int>_>.value.ptr + 4));
  if (!bVar3) {
    text_1.content.size_._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (text_1.content.size_._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x151,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      text_1.content.size_._7_1_ = false;
    }
  }
  Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_>::~Maybe
            ((Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_> *)local_6c);
  IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)
             ((long)&result.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Maybe<unsigned_int>_>.
                     value.ptr + 4));
  ppcVar1 = &input_1.best;
  StringPtr::StringPtr((StringPtr *)ppcVar1,"br");
  pcVar9 = StringPtr::begin((StringPtr *)ppcVar1);
  pcVar10 = StringPtr::end((StringPtr *)ppcVar1);
  pIVar2 = (IteratorInput<char,_const_char_*> *)
           ((long)&result_1.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Maybe<unsigned_int>_>.
                   value.ptr + 4);
  IteratorInput<char,_const_char_*>::IteratorInput(pIVar2,pcVar9,pcVar10);
  Sequence_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:318:31)>,_kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:319:40)>_>,_kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:320:31)>_>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_> *)
             ((long)&value_1 + 4),&local_17,pIVar2);
  pTStack_130 = kj::_::readMaybe<kj::_::Tuple<unsigned_int,kj::Maybe<unsigned_int>,unsigned_int>>
                          ((Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_>
                            *)((long)&value_1 + 4));
  if (pTStack_130 == (Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int> *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_158,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x15d);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_158,(char (*) [33])"Expected result tuple, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_158);
  }
  else {
    pTVar11 = get<0ul,kj::_::Tuple<unsigned_int,kj::Maybe<unsigned_int>,unsigned_int>&>(pTStack_130)
    ;
    if (*pTVar11 != 0x7b) {
      _kj_shouldLog_5 = kj::_::Debug::shouldLog(ERROR);
      while (_kj_shouldLog_5 != false) {
        local_138 = 0x7b;
        pTVar11 = get<0ul,kj::_::Tuple<unsigned_int,kj::Maybe<unsigned_int>,unsigned_int>&>
                            (pTStack_130);
        kj::_::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                   ,0x159,ERROR,
                   "\"failed: expected \" \"(123u) == (get<0>(*value))\", 123u, get<0>(*value)",
                   (char (*) [44])"failed: expected (123u) == (get<0>(*value))",&local_138,pTVar11);
        _kj_shouldLog_5 = false;
      }
    }
    pTVar12 = get<1ul,kj::_::Tuple<unsigned_int,kj::Maybe<unsigned_int>,unsigned_int>&>(pTStack_130)
    ;
    bVar3 = Maybe<unsigned_int>::operator==(pTVar12,(void *)0x0);
    if (!bVar3) {
      local_139 = kj::_::Debug::shouldLog(ERROR);
      while (local_139 != false) {
        kj::_::Debug::log<char_const(&)[43]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                   ,0x15a,ERROR,"\"failed: expected \" \"get<1>(*value) == nullptr\"",
                   (char (*) [43])"failed: expected get<1>(*value) == nullptr");
        local_139 = false;
      }
    }
    pTVar13 = get<2ul,kj::_::Tuple<unsigned_int,kj::Maybe<unsigned_int>,unsigned_int>&>(pTStack_130)
    ;
    if (*pTVar13 != 0x315) {
      local_13a = kj::_::Debug::shouldLog(ERROR);
      while (local_13a != false) {
        local_140 = 0x315;
        pTVar13 = get<2ul,kj::_::Tuple<unsigned_int,kj::Maybe<unsigned_int>,unsigned_int>&>
                            (pTStack_130);
        kj::_::Debug::log<char_const(&)[44],unsigned_int,unsigned_int&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                   ,0x15b,ERROR,
                   "\"failed: expected \" \"(789u) == (get<2>(*value))\", 789u, get<2>(*value)",
                   (char (*) [44])"failed: expected (789u) == (get<2>(*value))",&local_140,pTVar13);
        local_13a = false;
      }
    }
  }
  bVar3 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)
                     ((long)&result_1.ptr.field_1.value.impl.
                             super_TupleElement<1U,_kj::Maybe<unsigned_int>_>.value.ptr + 4));
  if (!bVar3) {
    text_2.content.size_._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (text_2.content.size_._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x15f,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      text_2.content.size_._7_1_ = false;
    }
  }
  Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_>::~Maybe
            ((Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_> *)
             ((long)&value_1 + 4));
  IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)
             ((long)&result_1.ptr.field_1.value.impl.
                     super_TupleElement<1U,_kj::Maybe<unsigned_int>_>.value.ptr + 4));
  ppcVar1 = &input_2.best;
  StringPtr::StringPtr((StringPtr *)ppcVar1,"bzr");
  pcVar9 = StringPtr::begin((StringPtr *)ppcVar1);
  pcVar10 = StringPtr::end((StringPtr *)ppcVar1);
  pIVar2 = (IteratorInput<char,_const_char_*> *)
           ((long)&result_2.ptr.field_1.value.impl.super_TupleElement<1U,_kj::Maybe<unsigned_int>_>.
                   value.ptr + 4);
  IteratorInput<char,_const_char_*>::IteratorInput(pIVar2,pcVar9,pcVar10);
  Sequence_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:318:31)>,_kj::parse::Optional_<kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:319:40)>_>,_kj::parse::Transform_<kj::parse::Exactly_<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++:320:31)>_>
  ::operator()<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_> *)local_1a4,
             &local_17,pIVar2);
  bVar3 = Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_>::operator==
                    ((Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_> *)
                     local_1a4,(void *)0x0);
  if (!bVar3) {
    local_1a5 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a5 != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x166,ERROR,"\"failed: expected \" \"result == nullptr\"",
                 (char (*) [35])"failed: expected result == nullptr");
      local_1a5 = false;
    }
  }
  Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_>::~Maybe
            ((Maybe<kj::_::Tuple<unsigned_int,_kj::Maybe<unsigned_int>,_unsigned_int>_> *)local_1a4)
  ;
  IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)
             ((long)&result_2.ptr.field_1.value.impl.
                     super_TupleElement<1U,_kj::Maybe<unsigned_int>_>.value.ptr + 4));
  return;
}

Assistant:

TEST(CommonParsers, OptionalParser) {
  auto parser = sequence(
      transform(exactly('b'), []() -> uint { return 123; }),
      optional(transform(exactly('a'), []() -> uint { return 456; })),
      transform(exactly('r'), []() -> uint { return 789; }));

  {
    StringPtr text = "bar";
    Input input(text.begin(), text.end());
    Maybe<Tuple<uint, Maybe<uint>, uint>> result = parser(input);
    KJ_IF_MAYBE(value, result) {
      EXPECT_EQ(123u, get<0>(*value));
      KJ_IF_MAYBE(value2, get<1>(*value)) {
        EXPECT_EQ(456u, *value2);
      } else {
        ADD_FAILURE() << "Expected 456, got null.";
      }
      EXPECT_EQ(789u, get<2>(*value));
    } else {
      ADD_FAILURE() << "Expected result tuple, got null.";
    }